

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int copy_zip_file(FILE *zip,file_entry_t *file,FILE *ozip,CentralDirectoryEntry *ent)

{
  char *__ptr;
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong __size;
  LocalFileHeader lfh;
  undefined1 local_56 [6];
  WORD local_50;
  WORD local_4e;
  short local_4c;
  short local_4a;
  UINT32 local_48;
  UINT32 local_44;
  UINT32 local_40;
  ushort local_3c;
  WORD local_3a;
  char *local_38;
  
  iVar4 = 0;
  iVar1 = fseek((FILE *)ozip,(ulong)ent->LocalHeaderOffset,0);
  iVar5 = 0;
  if ((((((iVar1 == 0) && (sVar2 = fread(local_56,0x1e,1,(FILE *)ozip), iVar5 = iVar4, sVar2 == 1))
        && (local_50 == ent->Flags)) && ((local_4e == ent->Method && (local_48 == ent->CRC32)))) &&
      ((local_44 == ent->CompressedSize &&
       ((local_40 == ent->UncompressedSize && (local_3c == ent->NameLength)))))) &&
     (local_3a == ent->ExtraLength)) {
    __size = (ulong)(local_44 + local_3c);
    local_38 = (char *)malloc(__size);
    if (local_38 != (char *)0x0) {
      sVar2 = fread(local_38,1,__size,(FILE *)ozip);
      __ptr = local_38;
      if ((sVar2 == __size) &&
         (iVar1 = strncmp(local_38,(char *)(ent + 1),(ulong)(uint)local_3c), iVar1 == 0)) {
        lVar3 = ftell((FILE *)zip);
        file->zip_offset = (uint)lVar3;
        sVar2 = fwrite(local_56,0x1e,1,(FILE *)zip);
        if ((sVar2 == 1) && (sVar2 = fwrite(__ptr,1,__size,(FILE *)zip), sVar2 == __size)) {
          free(__ptr);
          file->date = local_4a;
          file->time = local_4c;
          file->uncompressed_size = local_40;
          file->compressed_size = local_44;
          file->method = local_4e;
          file->crc32 = local_48;
          iVar5 = 1;
        }
        else {
          free(__ptr);
          iVar5 = -1;
        }
      }
      else {
        free(__ptr);
      }
    }
  }
  return iVar5;
}

Assistant:

int copy_zip_file(FILE *zip, file_entry_t *file, FILE *ozip, CentralDirectoryEntry *ent)
{
	LocalFileHeader lfh;
	BYTE *buf;
	UINT32 buf_size;

	if (fseek(ozip, LittleLong(ent->LocalHeaderOffset), SEEK_SET) != 0)
	{
		return 0;
	}
	if (fread(&lfh, sizeof(lfh), 1, ozip) != 1)
	{
		return 0;
	}
	// Check to make sure the local header matches the central directory.
	if (lfh.Flags != ent->Flags || lfh.Method != ent->Method ||
		lfh.CRC32 != ent->CRC32 || lfh.CompressedSize != ent->CompressedSize ||
		lfh.UncompressedSize != ent->UncompressedSize ||
		lfh.NameLength != ent->NameLength || lfh.ExtraLength != ent->ExtraLength)
	{
		return 0;
	}
	buf_size = LittleShort(lfh.NameLength) + LittleLong(lfh.CompressedSize);
	buf = malloc(buf_size);
	if (buf == NULL)
	{
		return 0;
	}
	if (fread(buf, 1, buf_size, ozip) != buf_size)
	{
		free(buf);
		return 0;
	}
	// Check to be sure name matches.
	if (strncmp((char *)buf, (char *)(ent + 1), LittleShort(lfh.NameLength)) != 0)
	{
		free(buf);
		return 0;
	}
	// Looks good. Let's write it in.
	file->zip_offset = ftell(zip);
	if (fwrite(&lfh, sizeof(lfh), 1, zip) != 1 ||
		fwrite(buf, 1, buf_size, zip) != buf_size)
	{
		free(buf);
		return -1;
	}
	free(buf);
	file->date = lfh.ModDate;
	file->time = lfh.ModTime;
	file->uncompressed_size = LittleLong(lfh.UncompressedSize);
	file->compressed_size = LittleLong(lfh.CompressedSize);
	file->method = LittleShort(lfh.Method);
	file->crc32 = lfh.CRC32;
	return 1;
}